

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  sel_t sVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  
  if (count + 0x3f < 0x40) {
    lVar11 = 0;
  }
  else {
    puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar11 = 0;
    uVar9 = 0;
    uVar14 = 0;
    do {
      if (puVar3 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar3[uVar9];
      }
      uVar15 = uVar14 + 0x40;
      if (count <= uVar14 + 0x40) {
        uVar15 = count;
      }
      uVar8 = uVar14;
      if (uVar13 == 0xffffffffffffffff) {
        if (uVar14 < uVar15) {
          psVar4 = sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          uVar13 = uVar14 << 4 | 8;
          do {
            uVar8 = uVar14;
            if (psVar4 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar4[uVar14];
            }
            iVar1 = *(int *)((long)ldata + (uVar13 - 8));
            iVar2 = *(int *)((long)rdata + (uVar13 - 8));
            if (((iVar1 == iVar2) &&
                (*(int *)((long)ldata + (uVar13 - 4)) == *(int *)((long)rdata + (uVar13 - 4)))) &&
               (*(long *)((long)&ldata->months + uVar13) == *(long *)((long)&rdata->months + uVar13)
               )) {
              uVar18 = 0;
            }
            else {
              lVar6 = *(long *)((long)&ldata->months + uVar13);
              lVar16 = (long)*(int *)((long)ldata + (uVar13 - 4)) + lVar6 / 86400000000;
              lVar7 = *(long *)((long)&rdata->months + uVar13);
              lVar17 = (long)*(int *)((long)rdata + (uVar13 - 4)) + lVar7 / 86400000000;
              uVar18 = 1;
              if (((long)iVar1 + lVar16 / 0x1e == (long)iVar2 + lVar17 / 0x1e) &&
                 (lVar16 % 0x1e == lVar17 % 0x1e)) {
                uVar18 = (ulong)(lVar6 % 86400000000 != lVar7 % 86400000000);
              }
            }
            psVar5[lVar11] = (sel_t)uVar8;
            lVar11 = lVar11 + uVar18;
            uVar14 = uVar14 + 1;
            uVar13 = uVar13 + 0x10;
            uVar8 = uVar14;
          } while (uVar15 != uVar14);
        }
      }
      else if (uVar13 == 0) {
        uVar8 = uVar15;
        if (uVar14 < uVar15) {
          psVar4 = sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          do {
            sVar10 = (sel_t)uVar14;
            if (psVar4 != (sel_t *)0x0) {
              sVar10 = psVar4[uVar14];
            }
            psVar5[lVar11] = sVar10;
            lVar11 = lVar11 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar15 != uVar14);
        }
      }
      else if (uVar14 < uVar15) {
        psVar4 = sel->sel_vector;
        psVar5 = false_sel->sel_vector;
        uVar18 = uVar14 << 4 | 8;
        uVar8 = 0;
        do {
          if (psVar4 == (sel_t *)0x0) {
            sVar10 = (int)uVar14 + (int)uVar8;
          }
          else {
            sVar10 = psVar4[uVar14 + uVar8];
          }
          uVar12 = 1;
          if ((uVar13 >> (uVar8 & 0x3f) & 1) != 0) {
            iVar1 = *(int *)((long)ldata + (uVar18 - 8));
            iVar2 = *(int *)((long)rdata + (uVar18 - 8));
            if (((iVar1 == iVar2) &&
                (*(int *)((long)ldata + (uVar18 - 4)) == *(int *)((long)rdata + (uVar18 - 4)))) &&
               (*(long *)((long)&ldata->months + uVar18) == *(long *)((long)&rdata->months + uVar18)
               )) {
              uVar12 = 0;
            }
            else {
              lVar6 = *(long *)((long)&ldata->months + uVar18);
              lVar16 = (long)*(int *)((long)ldata + (uVar18 - 4)) + lVar6 / 86400000000;
              lVar7 = *(long *)((long)&rdata->months + uVar18);
              lVar17 = (long)*(int *)((long)rdata + (uVar18 - 4)) + lVar7 / 86400000000;
              if (((long)iVar1 + lVar16 / 0x1e == (long)iVar2 + lVar17 / 0x1e) &&
                 (lVar16 % 0x1e == lVar17 % 0x1e)) {
                uVar12 = (ulong)(lVar6 % 86400000000 != lVar7 % 86400000000);
              }
            }
          }
          psVar5[lVar11] = sVar10;
          lVar11 = uVar12 + lVar11;
          uVar8 = uVar8 + 1;
          uVar18 = uVar18 + 0x10;
        } while ((uVar14 - uVar15) + uVar8 != 0);
        uVar8 = uVar14 + uVar8;
      }
      uVar9 = uVar9 + 1;
      uVar14 = uVar8;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return count - lVar11;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}